

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O0

CURLcode smb_connect(connectdata *conn,_Bool *done)

{
  void *pvVar1;
  char *pcVar2;
  char *local_30;
  char *slash;
  smb_conn *smbc;
  _Bool *done_local;
  connectdata *conn_local;
  
  if ((*(uint *)&(conn->bits).field_0x4 >> 8 & 1) == 0) {
    conn_local._4_4_ = CURLE_LOGIN_DENIED;
  }
  else {
    (conn->proto).smbc.state = SMB_CONNECTING;
    pvVar1 = (*Curl_cmalloc)(0x9000);
    (conn->proto).ftpc.pp.sendleft = (size_t)pvVar1;
    if ((conn->proto).ftpc.pp.sendleft == 0) {
      conn_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      Curl_conncontrol(conn,0);
      local_30 = strchr(conn->user,0x2f);
      if (local_30 == (char *)0x0) {
        local_30 = strchr(conn->user,0x5c);
      }
      if (local_30 == (char *)0x0) {
        (conn->proto).ftpc.pp.cache_size = (size_t)conn->user;
        pcVar2 = (*Curl_cstrdup)((conn->host).name);
        (conn->proto).ftpc.pp.nread_resp = (size_t)pcVar2;
        if ((conn->proto).ftpc.pp.nread_resp == 0) {
          return CURLE_OUT_OF_MEMORY;
        }
      }
      else {
        (conn->proto).ftpc.pp.cache_size = (size_t)(local_30 + 1);
        pcVar2 = (*Curl_cstrdup)(conn->user);
        (conn->proto).ftpc.pp.nread_resp = (size_t)pcVar2;
        if ((conn->proto).ftpc.pp.nread_resp == 0) {
          return CURLE_OUT_OF_MEMORY;
        }
        local_30[(conn->proto).ftpc.pp.nread_resp - (long)conn->user] = '\0';
      }
      conn_local._4_4_ = CURLE_OK;
    }
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode smb_connect(struct connectdata *conn, bool *done)
{
  struct smb_conn *smbc = &conn->proto.smbc;
  char *slash;

  (void) done;

  /* Check we have a username and password to authenticate with */
  if(!conn->bits.user_passwd)
    return CURLE_LOGIN_DENIED;

  /* Initialize the connection state */
  smbc->state = SMB_CONNECTING;
  smbc->recv_buf = malloc(MAX_MESSAGE_SIZE);
  if(!smbc->recv_buf)
    return CURLE_OUT_OF_MEMORY;

  /* Multiple requests are allowed with this connection */
  connkeep(conn, "SMB default");

  /* Parse the username, domain, and password */
  slash = strchr(conn->user, '/');
  if(!slash)
    slash = strchr(conn->user, '\\');

  if(slash) {
    smbc->user = slash + 1;
    smbc->domain = strdup(conn->user);
    if(!smbc->domain)
      return CURLE_OUT_OF_MEMORY;
    smbc->domain[slash - conn->user] = 0;
  }
  else {
    smbc->user = conn->user;
    smbc->domain = strdup(conn->host.name);
    if(!smbc->domain)
      return CURLE_OUT_OF_MEMORY;
  }

  return CURLE_OK;
}